

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O0

void qt_bitmapblit_rgb30<(QtPixelOrder)1>
               (QRasterBuffer *rasterBuffer,int x,int y,QRgba64 *color,uchar *map,int mapWidth,
               int mapHeight,int mapStride)

{
  long lVar1;
  QRgba64 in_RCX;
  uint in_ESI;
  undefined8 in_RDI;
  undefined8 in_R8;
  int mapWidth_00;
  long in_FS_OFFSET;
  int unaff_retaddr;
  int in_stack_00000008;
  QRasterBuffer *rasterBuffer_00;
  
  mapWidth_00 = (int)((ulong)in_R8 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  rasterBuffer_00 = *(QRasterBuffer **)in_RCX.rgba;
  qConvertRgb64ToRgb30<(QtPixelOrder)1>(in_RCX);
  qt_bitmapblit_template<unsigned_int>
            (rasterBuffer_00,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,in_ESI,(uchar *)in_RCX.rgba,
             mapWidth_00,unaff_retaddr,in_stack_00000008);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline static void qt_bitmapblit_rgb30(QRasterBuffer *rasterBuffer,
                                   int x, int y, const QRgba64 &color,
                                   const uchar *map,
                                   int mapWidth, int mapHeight, int mapStride)
{
    qt_bitmapblit_template<quint32>(rasterBuffer, x, y, qConvertRgb64ToRgb30<PixelOrder>(color),
                                    map, mapWidth, mapHeight, mapStride);
}